

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

bool TTD::NSLogEvents::JsRTCallFunctionAction_GetLastExecutedStatementAndFrameInfoForDebugger
               (EventLogEntry *evt,TTDebuggerSourceLocation *lastSourceInfo)

{
  bool bVar1;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    bVar1 = TTDebuggerSourceLocation::HasValue
                      ((TTDebuggerSourceLocation *)(evt[3].EventTimeStamp + 0x10));
    if (bVar1) {
      TTDebuggerSourceLocation::SetLocationCopy
                (lastSourceInfo,(TTDebuggerSourceLocation *)(evt[3].EventTimeStamp + 0x10));
    }
    else {
      TTDebuggerSourceLocation::Clear(lastSourceInfo);
    }
    return bVar1;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

bool JsRTCallFunctionAction_GetLastExecutedStatementAndFrameInfoForDebugger(const EventLogEntry* evt, TTDebuggerSourceLocation& lastSourceInfo)
        {
            const JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);
            if(cfAction->AdditionalReplayInfo->LastExecutedLocation.HasValue())
            {
                lastSourceInfo.SetLocationCopy(cfAction->AdditionalReplayInfo->LastExecutedLocation);
                return true;
            }
            else
            {
                lastSourceInfo.Clear();
                return false;
            }
        }